

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_socket_manager.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::utp_socket_manager::utp_socket_manager
          (utp_socket_manager *this,send_fun_t *send_fun,incoming_utp_callback_t *cb,io_context *ios
          ,session_settings *sett,counters *cnt,void *ssl_context)

{
  _Rb_tree_header *p_Var1;
  value_type_conflict2 local_34;
  
  ::std::
  function<void_(std::weak_ptr<libtorrent::aux::utp_socket_interface>,_const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_&,_libtorrent::span<const_char>,_boost::system::error_code_&,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>)>
  ::function(&this->m_send_fun,send_fun);
  ::std::
  function<void_(libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>)>
  ::function(&this->m_cb,cb);
  (this->m_utp_sockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->m_utp_sockets)._M_t._M_impl.super__Rb_tree_header;
  (this->m_utp_sockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_utp_sockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_utp_sockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_utp_sockets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_deferred_ack = (utp_socket_impl *)0x0;
  (this->m_temp_sockets).
  super__Vector_base<libtorrent::aux::utp_socket_impl_*,_std::allocator<libtorrent::aux::utp_socket_impl_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_temp_sockets).
  super__Vector_base<libtorrent::aux::utp_socket_impl_*,_std::allocator<libtorrent::aux::utp_socket_impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_temp_sockets).
  super__Vector_base<libtorrent::aux::utp_socket_impl_*,_std::allocator<libtorrent::aux::utp_socket_impl_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_drained_event).
  super__Vector_base<libtorrent::aux::utp_socket_impl_*,_std::allocator<libtorrent::aux::utp_socket_impl_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_drained_event).
  super__Vector_base<libtorrent::aux::utp_socket_impl_*,_std::allocator<libtorrent::aux::utp_socket_impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_drained_event).
  super__Vector_base<libtorrent::aux::utp_socket_impl_*,_std::allocator<libtorrent::aux::utp_socket_impl_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_stalled_sockets).
  super__Vector_base<libtorrent::aux::utp_socket_impl_*,_std::allocator<libtorrent::aux::utp_socket_impl_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_stalled_sockets).
  super__Vector_base<libtorrent::aux::utp_socket_impl_*,_std::allocator<libtorrent::aux::utp_socket_impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_stalled_sockets).
  super__Vector_base<libtorrent::aux::utp_socket_impl_*,_std::allocator<libtorrent::aux::utp_socket_impl_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_last_socket = (utp_socket_impl *)0x0;
  this->m_new_connection = -1;
  this->m_sett = sett;
  this->m_counters = cnt;
  this->m_ios = ios;
  this->m_mtu_idx = 0;
  this->m_ssl_context = ssl_context;
  packet_pool::packet_pool(&this->m_packet_pool);
  ::std::array<int,_3UL>::fill(&this->m_restrict_mtu,&local_34);
  return;
}

Assistant:

utp_socket_manager::utp_socket_manager(
		send_fun_t send_fun
		, incoming_utp_callback_t cb
		, io_context& ios
		, aux::session_settings const& sett
		, counters& cnt
		, void* ssl_context)
		: m_send_fun(std::move(send_fun))
		, m_cb(std::move(cb))
		, m_sett(sett)
		, m_counters(cnt)
		, m_ios(ios)
		, m_ssl_context(ssl_context)
	{
		m_restrict_mtu.fill(65536);
	}